

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int pack_particle_slice(int left,int width,vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  int iVar1;
  int k;
  int iVar2;
  int j;
  size_t p_index;
  size_t pn_index;
  size_t local_48;
  int local_3c;
  size_t local_38;
  
  local_48._0_4_ = 0;
  local_38 = 0;
  local_48 = 0;
  if (0 < width) {
    local_3c = width + left;
    iVar1 = ny_global;
    do {
      if (0 < iVar1) {
        j = 0;
        iVar2 = nz_global;
        do {
          if (0 < iVar2) {
            k = 0;
            do {
              pack_cell(left,j,k,particle_numbers,&local_38,particles,&local_48);
              k = k + 1;
              iVar1 = ny_global;
              iVar2 = nz_global;
            } while (k < nz_global);
          }
          j = j + 1;
        } while (j < iVar1);
      }
      left = left + 1;
    } while (left < local_3c);
  }
  return (int)local_48;
}

Assistant:

int pack_particle_slice(int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(i, j, k, particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}